

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int printfConsumer(jx9_context *pCtx,char *zInput,int nLen,void *pUserData)

{
  jx9_context_output(pCtx,zInput,nLen);
  *(long *)pUserData = *pUserData + (long)nLen;
  return 0;
}

Assistant:

static int printfConsumer(jx9_context *pCtx, const char *zInput, int nLen, void *pUserData)
{
	jx9_int64 *pCounter = (jx9_int64 *)pUserData;
	/* Call the VM output consumer directly */
	jx9_context_output(pCtx, zInput, nLen);
	/* Increment counter */
	*pCounter += nLen;
	return JX9_OK;
}